

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeGravityForces
          (ChElementShellANCF_3443 *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*pauVar5) [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  auVar6 = _DAT_009de100;
  auVar16 = _DAT_009de0c0;
  if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0x30)
  {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = G_acc->m_data[0];
    auVar7 = vbroadcastsd_avx512f(auVar2);
    pauVar5 = (undefined1 (*) [64])
              (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar15 = *(undefined1 (*) [64])
               (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>.m_storage.m_data.array
    ;
    auVar1 = *(undefined1 (*) [64])
              ((this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>.m_storage.m_data.array
              + 8);
    auVar8 = vmulpd_avx512f(auVar15,auVar7);
    auVar9 = vmulpd_avx512f(auVar1,auVar7);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = G_acc->m_data[1];
    auVar7 = vbroadcastsd_avx512f(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = G_acc->m_data[2];
    auVar10 = vbroadcastsd_avx512f(auVar4);
    auVar11 = vmulpd_avx512f(auVar15,auVar7);
    auVar12 = vmulpd_avx512f(auVar1,auVar7);
    auVar13 = vmulpd_avx512f(auVar15,auVar10);
    auVar14 = vmulpd_avx512f(auVar1,auVar10);
    vpermt2pd_avx512f(_DAT_009de0c0,auVar11);
    auVar15 = vpermt2pd_avx512f(_DAT_009de100,auVar13);
    *pauVar5 = auVar15;
    auVar1 = _DAT_009de180;
    auVar15 = _DAT_009de140;
    vpermt2pd_avx512f(_DAT_009de140,auVar8);
    auVar7 = vpermt2pd_avx512f(_DAT_009de180,auVar11);
    pauVar5[1] = auVar7;
    auVar10 = _DAT_009de200;
    auVar7 = _DAT_009de1c0;
    vpermt2pd_avx512f(_DAT_009de1c0,auVar13);
    auVar8 = vpermt2pd_avx512f(_DAT_009de200,auVar8);
    pauVar5[2] = auVar8;
    vpermi2pd_avx512f(auVar16,auVar9,auVar12);
    auVar16 = vpermt2pd_avx512f(auVar6,auVar14);
    pauVar5[3] = auVar16;
    vpermi2pd_avx512f(auVar15,auVar14,auVar9);
    auVar16 = vpermt2pd_avx512f(auVar1,auVar12);
    pauVar5[4] = auVar16;
    vpermt2pd_avx512f(auVar7,auVar14);
    auVar16 = vpermt2pd_avx512f(auVar10,auVar9);
    pauVar5[5] = auVar16;
    return;
  }
  __assert_fail("Fg.size() == 3 * NSF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3443.cpp"
                ,0x1f0,
                "virtual void chrono::fea::ChElementShellANCF_3443::ComputeGravityForces(ChVectorDynamic<> &, const ChVector<> &)"
               );
}

Assistant:

void ChElementShellANCF_3443::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 3 * NSF);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<MatrixNx3> GravForceCompact(Fg.data(), NSF, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}